

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O2

bool anon_unknown.dwarf_d52362::WorkflowStepTypeHelper(Type *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String SStack_48;
  
  if (value == (Value *)0x0) {
    cmCMakePresetsErrors::INVALID_PRESET((Value *)0x0,state);
    return false;
  }
  bVar1 = Json::Value::isString(value);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&SStack_48,value);
    bVar1 = std::operator==(&SStack_48,"configure");
    std::__cxx11::string::~string((string *)&SStack_48);
    if (bVar1) {
      *out = Configure;
    }
    else {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"build");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (bVar1) {
        *out = Build;
      }
      else {
        Json::Value::asString_abi_cxx11_(&SStack_48,value);
        bVar1 = std::operator==(&SStack_48,"test");
        std::__cxx11::string::~string((string *)&SStack_48);
        if (bVar1) {
          *out = Test;
        }
        else {
          Json::Value::asString_abi_cxx11_(&SStack_48,value);
          bVar1 = std::operator==(&SStack_48,"package");
          std::__cxx11::string::~string((string *)&SStack_48);
          if (!bVar1) {
            cmCMakePresetsErrors::INVALID_PRESET(value,state);
            goto LAB_002eb902;
          }
          *out = Package;
        }
      }
    }
    bVar1 = true;
  }
  else {
LAB_002eb902:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WorkflowStepTypeHelper(WorkflowPreset::WorkflowStep::Type& out,
                            const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (!value->isString()) {
    return false;
  }

  if (value->asString() == "configure") {
    out = WorkflowPreset::WorkflowStep::Type::Configure;
    return true;
  }

  if (value->asString() == "build") {
    out = WorkflowPreset::WorkflowStep::Type::Build;
    return true;
  }

  if (value->asString() == "test") {
    out = WorkflowPreset::WorkflowStep::Type::Test;
    return true;
  }

  if (value->asString() == "package") {
    out = WorkflowPreset::WorkflowStep::Type::Package;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}